

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::CryptoTest::TestSHA256(CryptoTest *this,string *in,string *hexout)

{
  long in_FS_OFFSET;
  string_view hex_str;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_a8;
  CSHA256 local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&local_90);
  hex_str._M_str = (hexout->_M_dataplus)._M_p;
  hex_str._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_a8,hex_str);
  TestVector<CSHA256,std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (this,&local_90,in,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestSHA256(const std::string &in, const std::string &hexout) { TestVector(CSHA256(), in, ParseHex(hexout));}